

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_replacement.cpp
# Opt level: O3

void __thiscall duckdb::CSVSniffer::ReplaceTypes(CSVSniffer *this)

{
  vector<bool,_true> *this_00;
  CSVReaderOptions *pCVar1;
  pointer pLVar2;
  pointer pLVar3;
  pointer this_01;
  CSVStateMachine *pCVar4;
  reference __k;
  const_iterator cVar5;
  const_reference pvVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  CSVErrorHandler *this_02;
  BinderException *this_03;
  ulong uVar9;
  idx_t i;
  size_type __n;
  reference rVar10;
  initializer_list<duckdb::LogicalType> __l;
  __alloc_node_gen_t __alloc_node_gen;
  CSVError error_msg;
  allocator_type local_151;
  key_type local_150;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>_>_>
  local_148;
  pointer pLStack_140;
  pointer local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_128;
  vector<duckdb::LogicalType,_true> *local_120;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_118;
  LogicalType local_110;
  CSVError local_f8;
  undefined8 local_68;
  size_type local_60;
  undefined8 local_58;
  size_type local_50;
  undefined8 local_48;
  size_t sStack_40;
  undefined8 local_38;
  
  this_01 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
            ::operator->(&this->best_candidate);
  pCVar4 = BaseScanner::GetStateMachine(&this_01->super_BaseScanner);
  local_148._M_h = local_148._M_h & 0xffffffffffffff00;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_f8,
             ((long)(this->detected_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->detected_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (bool *)&local_148,(allocator_type *)&local_110);
  this_00 = &this->manually_set;
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)this_00);
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)local_f8.full_error_message._M_dataplus._M_p;
  *(undefined4 *)
   &(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = local_f8.error_message.field_2._M_allocated_capacity._0_4_;
  *(undefined4 *)
   ((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 4) =
       local_f8.error_message.field_2._M_allocated_capacity._4_4_;
  *(undefined4 *)
   ((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 8) = local_f8.error_message.field_2._8_4_;
  *(undefined4 *)
   ((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 0xc) = local_f8.error_message.field_2._12_4_;
  *(undefined4 *)
   &(this_00->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_f8.error_message._M_dataplus._M_p._0_4_;
  *(undefined4 *)
   ((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 4) = local_f8.error_message._M_dataplus._M_p._4_4_;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) =
       (uint)local_f8.error_message._M_string_length;
  *(undefined4 *)
   ((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 0xc) = local_f8.error_message._M_string_length._4_4_;
  pCVar1 = pCVar4->options;
  pLVar2 = (pCVar1->sql_type_list).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (pCVar1->sql_type_list).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pLVar2 != pLVar3) && (pCVar1->columns_set == false)) {
    local_120 = &this->detected_types;
    if ((pCVar1->sql_types_per_column)._M_h._M_element_count == 0) {
      if ((ulong)((long)(this->names).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->names).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <
          (ulong)(((long)pLVar3 - (long)pLVar2 >> 3) * -0x5555555555555555)) {
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        local_f8.error_message._M_dataplus._M_p = (pointer)&local_f8.error_message.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,
                   "read_csv: %d types were provided, but CSV file only has %d columns","");
        BinderException::BinderException<unsigned_long,unsigned_long>
                  (this_03,&local_f8.error_message,
                   ((long)(pCVar4->options->sql_type_list).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar4->options->sql_type_list).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                   (long)(this->names).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->names).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __n = 0;
      do {
        pvVar6 = vector<duckdb::LogicalType,_true>::operator[](&pCVar1->sql_type_list,__n);
        pvVar8 = vector<duckdb::LogicalType,_true>::operator[](local_120,__n);
        if (pvVar8 != pvVar6) {
          pvVar8->id_ = pvVar6->id_;
          pvVar8->physical_type_ = pvVar6->physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pvVar8->type_info_,&pvVar6->type_info_);
        }
        rVar10 = vector<bool,_true>::get<true>(this_00,__n);
        *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
        __n = __n + 1;
        pCVar1 = pCVar4->options;
      } while (__n < (ulong)(((long)(pCVar1->sql_type_list).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pCVar1->sql_type_list).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
    }
    else {
      local_128 = &this->names;
      local_150 = 0;
      if ((this->names).
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->names).
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar9 = 0;
      }
      else {
        local_118 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->best_sql_types_candidates_per_column_idx;
        uVar9 = 0;
        do {
          pCVar1 = pCVar4->options;
          __k = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](local_128,local_150);
          cVar5 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&pCVar1->sql_types_per_column,__k);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur != (__node_type *)0x0) {
            pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                               (&pCVar4->options->sql_type_list,
                                *(size_type *)
                                 ((long)cVar5.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x28));
            LogicalType::LogicalType(&local_110,pvVar6);
            __l._M_len = 1;
            __l._M_array = &local_110;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_148,__l,&local_151);
            pmVar7 = ::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_118,&local_150);
            local_f8.error_message.field_2._M_allocated_capacity =
                 (size_type)
                 (pmVar7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_f8.error_message._M_dataplus._M_p =
                 (pointer)(pmVar7->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_f8.error_message._M_string_length =
                 (size_type)
                 (pmVar7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pmVar7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_148._M_h;
            (pmVar7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish = pLStack_140;
            (pmVar7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_138;
            local_148._M_h = (__hashtable_alloc *)0x0;
            pLStack_140 = (pointer)0x0;
            local_138 = (pointer)0x0;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_f8);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_148);
            LogicalType::~LogicalType(&local_110);
            pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                               (&pCVar4->options->sql_type_list,
                                *(size_type *)
                                 ((long)cVar5.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x28));
            pvVar8 = vector<duckdb::LogicalType,_true>::operator[](local_120,local_150);
            if (pvVar8 != pvVar6) {
              pvVar8->id_ = pvVar6->id_;
              pvVar8->physical_type_ = pvVar6->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&pvVar8->type_info_,&pvVar6->type_info_);
            }
            rVar10 = vector<bool,_true>::get<true>(this_00,local_150);
            *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
            uVar9 = uVar9 + 1;
          }
          local_150 = local_150 + 1;
        } while (local_150 <
                 (ulong)((long)(this->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if ((this->file_options->union_by_name == false) &&
         (uVar9 < (pCVar4->options->sql_types_per_column)._M_h._M_element_count)) {
        pCVar1 = this->options;
        local_68 = 0;
        local_60 = (pCVar1->sql_types_per_column)._M_h._M_bucket_count;
        local_58 = 0;
        local_50 = (pCVar1->sql_types_per_column)._M_h._M_element_count;
        local_48 = *(undefined8 *)&(pCVar1->sql_types_per_column)._M_h._M_rehash_policy;
        sStack_40 = (pCVar1->sql_types_per_column)._M_h._M_rehash_policy._M_next_resize;
        local_38 = 0;
        local_148._M_h = (__hashtable_alloc *)&local_68;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,unsigned_long>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,&(pCVar1->sql_types_per_column)._M_h,&local_148);
        CSVError::ColumnTypesError(&local_f8,(case_insensitive_map_t<idx_t> *)&local_68,local_128);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_68);
        this_02 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->error_handler);
        CSVErrorHandler::Error(this_02,&local_f8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.csv_row._M_dataplus._M_p != &local_f8.csv_row.field_2) {
          operator_delete(local_f8.csv_row._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.full_error_message._M_dataplus._M_p != &local_f8.full_error_message.field_2)
        {
          operator_delete(local_f8.full_error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.error_message._M_dataplus._M_p != &local_f8.error_message.field_2) {
          operator_delete(local_f8.error_message._M_dataplus._M_p);
        }
      }
    }
  }
  return;
}

Assistant:

void CSVSniffer::ReplaceTypes() {
	auto &sniffing_state_machine = best_candidate->GetStateMachine();
	manually_set = vector<bool>(detected_types.size(), false);
	if (sniffing_state_machine.options.sql_type_list.empty() || sniffing_state_machine.options.columns_set) {
		return;
	}
	// user-defined types were supplied for certain columns
	// override the types
	if (!sniffing_state_machine.options.sql_types_per_column.empty()) {
		// types supplied as name -> value map
		idx_t found = 0;
		for (idx_t i = 0; i < names.size(); i++) {
			auto it = sniffing_state_machine.options.sql_types_per_column.find(names[i]);
			if (it != sniffing_state_machine.options.sql_types_per_column.end()) {
				best_sql_types_candidates_per_column_idx[i] = {
				    sniffing_state_machine.options.sql_type_list[it->second]};
				detected_types[i] = sniffing_state_machine.options.sql_type_list[it->second];
				manually_set[i] = true;
				found++;
			}
		}
		if (!file_options.union_by_name && found < sniffing_state_machine.options.sql_types_per_column.size()) {
			auto error_msg = CSVError::ColumnTypesError(options.sql_types_per_column, names);
			error_handler->Error(error_msg);
		}
		return;
	}
	// types supplied as list
	if (names.size() < sniffing_state_machine.options.sql_type_list.size()) {
		throw BinderException("read_csv: %d types were provided, but CSV file only has %d columns",
		                      sniffing_state_machine.options.sql_type_list.size(), names.size());
	}
	for (idx_t i = 0; i < sniffing_state_machine.options.sql_type_list.size(); i++) {
		detected_types[i] = sniffing_state_machine.options.sql_type_list[i];
		manually_set[i] = true;
	}
}